

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-ipc-send-recv.c
# Opt level: O1

int run_ipc_send_recv_helper(uv_loop_t *loop,int inprocess)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  int iVar2;
  uv_loop_t *puVar3;
  uv_loop_t *puVar4;
  undefined8 *extraout_RDX;
  int iVar5;
  echo_ctx *peVar6;
  uv_loop_t *puVar7;
  uv_buf_t uStack_430;
  undefined1 auStack_420 [144];
  code *pcStack_390;
  uv_loop_t uStack_388;
  uv_loop_t *puStack_38;
  uv_loop_t *puStack_30;
  code *pcStack_28;
  code *pcStack_20;
  
  pcStack_20 = (code *)0x15f538;
  is_in_process = inprocess;
  memset(&ctx2,0,0x608);
  iVar2 = 0x2fe958;
  pcStack_20 = (code *)0x15f545;
  peVar6 = (echo_ctx *)loop;
  iVar1 = uv_pipe_init(loop,&ctx2.listen,0);
  if (iVar1 == 0) {
    iVar2 = 0x2fea60;
    pcStack_20 = (code *)0x15f561;
    peVar6 = (echo_ctx *)loop;
    iVar1 = uv_pipe_init(loop,&ctx2.channel,1);
    if (iVar1 != 0) goto LAB_0015f5d7;
    if (inprocess != 0) {
      peVar6 = &ctx2;
      iVar2 = 0x19044d;
      pcStack_20 = (code *)0x15f57c;
      iVar1 = uv_pipe_bind(&ctx2.listen,"/tmp/uv-test-sock3");
      if (iVar1 == 0) {
        pcStack_20 = (code *)0x15f598;
        iVar1 = uv_listen((uv_stream_t *)&ctx2,0x1000,listen_cb);
        if (iVar1 != 0) {
          pcStack_20 = (code *)0x15f5a1;
          run_ipc_send_recv_helper_cold_4();
          goto LAB_0015f5a1;
        }
        goto LAB_0015f5b8;
      }
      goto LAB_0015f5e1;
    }
LAB_0015f5a1:
    peVar6 = (echo_ctx *)&ctx2.channel;
    iVar2 = 0;
    pcStack_20 = (code *)0x15f5af;
    iVar1 = uv_pipe_open(&ctx2.channel,0);
    if (iVar1 == 0) {
      pcStack_20 = (code *)0x15f5b8;
      send_recv_start();
LAB_0015f5b8:
      pcStack_20 = (code *)0x15f5bd;
      notify_parent_process();
      iVar2 = 0;
      pcStack_20 = (code *)0x15f5c7;
      peVar6 = (echo_ctx *)loop;
      iVar1 = uv_run(loop,UV_RUN_DEFAULT);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015f5dc;
    }
  }
  else {
    pcStack_20 = (code *)0x15f5d7;
    run_ipc_send_recv_helper_cold_1();
LAB_0015f5d7:
    pcStack_20 = (code *)0x15f5dc;
    run_ipc_send_recv_helper_cold_2();
LAB_0015f5dc:
    pcStack_20 = (code *)0x15f5e1;
    run_ipc_send_recv_helper_cold_6();
LAB_0015f5e1:
    pcStack_20 = (code *)0x15f5e6;
    run_ipc_send_recv_helper_cold_3();
  }
  pcStack_20 = listen_cb;
  run_ipc_send_recv_helper_cold_5();
  if (peVar6 == &ctx2) {
    if (iVar2 != 0) goto LAB_0015f61b;
    pcStack_28 = (code *)0x15f60f;
    iVar1 = uv_accept((uv_stream_t *)&ctx2,(uv_stream_t *)&ctx2.channel);
    if (iVar1 == 0) {
      send_recv_start();
      return extraout_EAX;
    }
  }
  else {
    pcStack_28 = (code *)0x15f61b;
    listen_cb_cold_1();
LAB_0015f61b:
    pcStack_28 = (code *)0x15f620;
    listen_cb_cold_2();
  }
  pcStack_28 = send_recv_start;
  listen_cb_cold_3();
  puStack_30 = (uv_loop_t *)0x15f632;
  pcStack_28._0_4_ = extraout_EAX_00;
  iVar1 = uv_is_readable((uv_stream_t *)&ctx2.channel);
  if (iVar1 == 1) {
    puStack_30 = (uv_loop_t *)0x15f643;
    iVar1 = uv_is_writable((uv_stream_t *)&ctx2.channel);
    if (iVar1 != 1) goto LAB_0015f67d;
    puStack_30 = (uv_loop_t *)0x15f654;
    iVar1 = uv_is_closing((uv_handle_t *)&ctx2.channel);
    if (iVar1 != 0) goto LAB_0015f682;
    puStack_30 = (uv_loop_t *)0x15f672;
    iVar1 = uv_read_start((uv_stream_t *)&ctx2.channel,alloc_cb,read_cb);
    if (iVar1 == 0) {
      return (int)pcStack_28;
    }
  }
  else {
    puStack_30 = (uv_loop_t *)0x15f67d;
    send_recv_start_cold_1();
LAB_0015f67d:
    puStack_30 = (uv_loop_t *)0x15f682;
    send_recv_start_cold_2();
LAB_0015f682:
    puStack_30 = (uv_loop_t *)0x15f687;
    send_recv_start_cold_3();
  }
  puStack_30 = (uv_loop_t *)ipc_send_recv_helper;
  send_recv_start_cold_4();
  puStack_38 = (uv_loop_t *)0x15f692;
  puStack_30 = loop;
  puVar3 = uv_default_loop();
  puStack_38 = (uv_loop_t *)0x15f69c;
  run_ipc_send_recv_helper(puVar3,0);
  puStack_38 = (uv_loop_t *)0x15f6a1;
  puVar3 = uv_default_loop();
  puStack_38 = (uv_loop_t *)0x15f6b5;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  puStack_38 = (uv_loop_t *)0x15f6bf;
  uv_run(puVar3,UV_RUN_DEFAULT);
  puStack_38 = (uv_loop_t *)0x15f6c4;
  puVar4 = uv_default_loop();
  puStack_38 = (uv_loop_t *)0x15f6cc;
  iVar1 = uv_loop_close(puVar4);
  if (iVar1 == 0) {
    return 0;
  }
  puStack_38 = (uv_loop_t *)ipc_send_recv_helper_threadproc;
  ipc_send_recv_helper_cold_1();
  iVar1 = (int)&uStack_388;
  pcStack_390 = (code *)0x15f6e9;
  puStack_38 = puVar3;
  iVar2 = uv_loop_init(&uStack_388);
  if (iVar2 == 0) {
    pcStack_390 = (code *)0x15f6fd;
    run_ipc_send_recv_helper(&uStack_388,1);
    pcStack_390 = (code *)0x15f705;
    iVar1 = (int)&uStack_388;
    iVar2 = uv_loop_close(&uStack_388);
    puVar3 = &uStack_388;
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_390 = (code *)0x15f717;
    ipc_send_recv_helper_threadproc_cold_1();
  }
  pcStack_390 = run_test;
  ipc_send_recv_helper_threadproc_cold_2();
  puVar4 = (uv_loop_t *)auStack_420;
  puVar7 = (uv_loop_t *)auStack_420;
  pcStack_390 = (code *)puVar3;
  if (iVar1 == 0) {
    uStack_430.len = 0x15f7ac;
    spawn_helper(&ctx.channel,(uv_process_t *)(auStack_420 + 8),"ipc_send_recv_helper");
    uStack_430.len = 0x15f7ba;
    connect_cb(&ctx.connect_req,0);
LAB_0015f7ba:
    uStack_430.len = 0x15f7bf;
    puVar4 = uv_default_loop();
    iVar5 = 0;
    uStack_430.len = 0x15f7c9;
    iVar2 = uv_run(puVar4,UV_RUN_DEFAULT);
    if (iVar2 != 0) {
      uStack_430.len = 0x15f7f4;
      run_test_cold_3();
LAB_0015f7f4:
      uStack_430.len = 0x15f7f9;
      run_test_cold_4();
LAB_0015f7f9:
      uStack_430.len = 0x15f7fe;
      run_test_cold_1();
      goto LAB_0015f7fe;
    }
    if (recv_cb_count != 2) goto LAB_0015f7f4;
    if (iVar1 == 0) {
      return 0;
    }
    uStack_430.len = 0x15f7e2;
    iVar1 = uv_thread_join((uv_thread_t *)auStack_420);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    iVar5 = 0x15f6d9;
    uStack_430.len = 0x15f73e;
    iVar2 = uv_thread_create((uv_thread_t *)auStack_420,ipc_send_recv_helper_threadproc,(void *)0x2a
                            );
    if (iVar2 != 0) goto LAB_0015f7f9;
    uStack_430.len = 0x15f750;
    uv_sleep(1000);
    uStack_430.len = 0x15f755;
    puVar4 = uv_default_loop();
    iVar5 = 0x2fef60;
    uStack_430.len = 0x15f769;
    iVar2 = uv_pipe_init(puVar4,&ctx.channel,1);
    if (iVar2 == 0) {
      uStack_430.len = 0x15f792;
      uv_pipe_connect(&ctx.connect_req,&ctx.channel,"/tmp/uv-test-sock3",connect_cb);
      goto LAB_0015f7ba;
    }
LAB_0015f7fe:
    puVar7 = puVar4;
    uStack_430.len = 0x15f803;
    run_test_cold_2();
  }
  uStack_430.len = (size_t)connect_cb;
  run_test_cold_5();
  if (puVar7 == (uv_loop_t *)&ctx.connect_req) {
    if (iVar5 != 0) goto LAB_0015f8d8;
    uStack_430 = uv_buf_init(".",1);
    iVar1 = uv_write2(&ctx.write_req,(uv_stream_t *)&ctx,&uStack_430,1,&ctx.send.stream,
                      (uv_write_cb)0x0);
    if (iVar1 != 0) goto LAB_0015f8dd;
    uStack_430 = uv_buf_init(".",1);
    iVar1 = uv_write2(&ctx.write_req2,(uv_stream_t *)&ctx,&uStack_430,1,&ctx.send2.stream,
                      (uv_write_cb)0x0);
    if (iVar1 == 0) {
      iVar1 = uv_read_start((uv_stream_t *)&ctx,alloc_cb,recv_cb);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0015f8e7;
    }
  }
  else {
    connect_cb_cold_1();
LAB_0015f8d8:
    connect_cb_cold_2();
LAB_0015f8dd:
    connect_cb_cold_3();
  }
  connect_cb_cold_4();
LAB_0015f8e7:
  connect_cb_cold_5();
  *extraout_RDX = alloc_cb::slab;
  extraout_RDX[1] = 8;
  return 0x2ff734;
}

Assistant:

int run_ipc_send_recv_helper(uv_loop_t* loop, int inprocess) {
  int r;

  is_in_process = inprocess;

  memset(&ctx2, 0, sizeof(ctx2));

  r = uv_pipe_init(loop, &ctx2.listen, 0);
  ASSERT(r == 0);

  r = uv_pipe_init(loop, &ctx2.channel, 1);
  ASSERT(r == 0);

  if (inprocess) {
    r = uv_pipe_bind(&ctx2.listen, TEST_PIPENAME_3);
    ASSERT(r == 0);

    r = uv_listen((uv_stream_t*)&ctx2.listen, SOMAXCONN, listen_cb);
    ASSERT(r == 0);
  } else {
    r = uv_pipe_open(&ctx2.channel, 0);
    ASSERT(r == 0);

    send_recv_start();
  }

  notify_parent_process();
  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);

  return 0;
}